

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cli::Parser::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Parser *this,string *name)

{
  pointer ppCVar1;
  size_t __n;
  int iVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  CmdBase *pCVar6;
  pointer ppCVar7;
  bool bVar8;
  bool bVar9;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined8 uStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppCVar7 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar8 = ppCVar7 == ppCVar1;
  if (!bVar8) {
    local_58 = &__return_storage_ptr__->field_2;
    do {
      pCVar6 = *ppCVar7;
      __n = (pCVar6->name)._M_string_length;
      if (__n == name->_M_string_length) {
        if (__n == 0) {
          bVar9 = true;
        }
        else {
          iVar2 = bcmp((pCVar6->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
          bVar9 = iVar2 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        if ((pCVar6 == (CmdBase *)0x0) ||
           (pCVar6->_vptr_CmdBase != (_func_int **)&PTR__CmdArgument_00126bf0)) {
          pCVar6 = (CmdBase *)0x0;
        }
        if (pCVar6 == (CmdBase *)0x0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,"Invalid usage of the parameter ",name);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50," detected.");
          local_78 = (size_type *)(pbVar4->_M_dataplus)._M_p;
          paVar5 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78 == paVar5) {
            local_68 = paVar5->_M_allocated_capacity;
            uStack_60 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_78 = &local_68;
          }
          else {
            local_68 = paVar5->_M_allocated_capacity;
          }
          local_70 = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar3,(string *)&local_78);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pCVar6[1]._vptr_CmdBase,
                   pCVar6[1].name._M_dataplus._M_p + (long)pCVar6[1]._vptr_CmdBase);
        if (bVar9) {
          if (!bVar8) {
            return __return_storage_ptr__;
          }
          break;
        }
      }
      ppCVar7 = ppCVar7 + 1;
      bVar8 = ppCVar7 == ppCVar1;
    } while (!bVar8);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"The parameter ",name);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50," could not be found.");
  local_78 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78 == paVar5) {
    local_68 = paVar5->_M_allocated_capacity;
    uStack_60 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_78 = &local_68;
  }
  else {
    local_68 = paVar5->_M_allocated_capacity;
  }
  local_70 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(prVar3,(string *)&local_78);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}